

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::logTestInfoIter(CopyImageTest *this)

{
  TestLog *log_00;
  TestLog *log;
  CopyImageTest *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  logTestInfo(log_00,&this->m_srcImageInfo,&this->m_dstImageInfo);
  return;
}

Assistant:

void CopyImageTest::logTestInfoIter (void)
{
	TestLog& log = m_testCtx.getLog();

	logTestInfo(log, m_srcImageInfo, m_dstImageInfo);
}